

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O1

void * lys_set_private(lys_node *node,void *priv)

{
  void *pvVar1;
  
  if (node == (lys_node *)0x0) {
    pvVar1 = (void *)0x0;
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid arguments (%s()).","lys_set_private");
  }
  else {
    pvVar1 = node->priv;
    node->priv = priv;
  }
  return pvVar1;
}

Assistant:

API void *
lys_set_private(const struct lys_node *node, void *priv)
{
    void *prev;

    if (!node) {
        LOGARG;
        return NULL;
    }

    prev = node->priv;
    ((struct lys_node *)node)->priv = priv;

    return prev;
}